

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters.h
# Opt level: O0

void __thiscall sparse_parameters::~sparse_parameters(sparse_parameters *this)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false> *in_RDI;
  iterator iter;
  unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
  *in_stack_ffffffffffffffd8;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_18;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_10 [2];
  
  if ((((ulong)in_RDI[8].super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
               _M_cur & 0x10000000000) == 0) &&
     (((ulong)in_RDI[8].super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
              _M_cur & 0x100000000) == 0)) {
    local_10[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
         ::begin(in_stack_ffffffffffffffd8);
    while( true ) {
      local_18._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
           ::end(in_stack_ffffffffffffffd8);
      bVar1 = std::__detail::operator!=(local_10,&local_18);
      if (!bVar1) break;
      ppVar2 = std::__detail::_Node_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false> *
                            )0x12d301);
      free(ppVar2->second);
      std::__detail::_Node_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false>::
      operator++(in_RDI);
    }
    std::
    unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
    ::clear((unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
             *)0x12d320);
    *(undefined1 *)
     ((long)&in_RDI[8].super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
             _M_cur + 5) = 1;
  }
  if (in_RDI[9].super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur !=
      (__node_type *)0x0) {
    free(in_RDI[9].super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur)
    ;
  }
  free(in_RDI[10].super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur);
  std::
  unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
  ::~unordered_map((unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
                    *)0x12d35b);
  return;
}

Assistant:

~sparse_parameters()
  {
    if (!_delete && !_seeded)  // don't free weight vector if it is shared with another instance
    {
      for (auto iter = _map.begin(); iter != _map.end(); ++iter) free(iter->second);
      _map.clear();
      _delete = true;
    }
    if (default_data != nullptr)
      free(default_data);
    free(default_value);
  }